

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addReporter(Catch *this,Ptr<Catch::IStreamingReporter> *existingReporter,
                  Ptr<Catch::IStreamingReporter> *additionalReporter)

{
  IStreamingReporter *in_RAX;
  IStreamingReporter *pIVar1;
  Ptr<Catch::IStreamingReporter> local_28;
  
  *(undefined8 *)this = 0;
  if (existingReporter->m_p == (IStreamingReporter *)0x0) {
    Ptr<Catch::IStreamingReporter>::operator=
              ((Ptr<Catch::IStreamingReporter> *)this,additionalReporter);
  }
  else {
    local_28.m_p = in_RAX;
    pIVar1 = (IStreamingReporter *)
             __dynamic_cast(existingReporter->m_p,&IStreamingReporter::typeinfo,
                            &MultipleReporters::typeinfo,0);
    if (pIVar1 == (IStreamingReporter *)0x0) {
      pIVar1 = (IStreamingReporter *)operator_new(0x28);
      (pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__MultipleReporters_00145728;
      pIVar1[4].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      pIVar1[2].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      pIVar1[3].super_IShared.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      *(undefined4 *)&pIVar1[1].super_IShared.super_NonCopyable._vptr_NonCopyable = 1;
      local_28.m_p = pIVar1;
      Ptr<Catch::IStreamingReporter>::operator=((Ptr<Catch::IStreamingReporter> *)this,&local_28);
      Ptr<Catch::IStreamingReporter>::~Ptr(&local_28);
      if (existingReporter->m_p != (IStreamingReporter *)0x0) {
        std::
        vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
        ::push_back((vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
                     *)(pIVar1 + 2),existingReporter);
      }
    }
    else {
      Ptr<Catch::IStreamingReporter>::operator=
                ((Ptr<Catch::IStreamingReporter> *)this,existingReporter);
    }
    std::
    vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
    ::push_back((vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
                 *)(pIVar1 + 2),additionalReporter);
  }
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> addReporter( Ptr<IStreamingReporter> const& existingReporter, Ptr<IStreamingReporter> const& additionalReporter ) {
    Ptr<IStreamingReporter> resultingReporter;

    if( existingReporter ) {
        MultipleReporters* multi = dynamic_cast<MultipleReporters*>( existingReporter.get() );
        if( !multi ) {
            multi = new MultipleReporters;
            resultingReporter = Ptr<IStreamingReporter>( multi );
            if( existingReporter )
                multi->add( existingReporter );
        }
        else
            resultingReporter = existingReporter;
        multi->add( additionalReporter );
    }
    else
        resultingReporter = additionalReporter;

    return resultingReporter;
}